

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandMinisat(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  printf("This command is currently disabled.\n");
  return 1;
}

Assistant:

int Abc_CommandMinisat( Abc_Frame_t * pAbc, int argc, char ** argv )
{
#ifdef USE_MINISAT22
    extern int MainSat(int argc, char** argv);
    MainSat( argc, argv );
#else
    printf( "This command is currently disabled.\n" );
#endif
    return 1;
}